

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_ffh_tostring(lua_State *L)

{
  TValue *pTVar1;
  cTValue *pcVar2;
  GCstr *pGVar3;
  void *pvVar4;
  lua_State *in_RDI;
  GCstr *s;
  cTValue *mo;
  TValue *o;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  lua_State *in_stack_ffffffffffffff70;
  char *pcVar5;
  uint in_stack_ffffffffffffff78;
  uint uVar6;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 local_78;
  MMS mm;
  cTValue *in_stack_ffffffffffffff90;
  int local_54;
  
  mm = (MMS)((ulong)_local_78 >> 0x20);
  pTVar1 = lj_lib_checkany(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  in_RDI->top = pTVar1 + 1;
  pcVar2 = lj_meta_lookup((lua_State *)&pTVar1->field_2,in_stack_ffffffffffffff90,mm);
  if ((pcVar2->field_2).it == 0xffffffff) {
    if ((pTVar1->field_2).it < 0xffff0000) {
      pGVar3 = lj_str_fromnumber(in_stack_ffffffffffffff70,
                                 (cTValue *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      local_78.i = (int32_t)pGVar3;
    }
    else if ((pTVar1->field_2).it < 0xfffffffd) {
      if (((pTVar1->field_2).it == 0xfffffff7) && (1 < *(byte *)((ulong)(pTVar1->u32).lo + 6))) {
        lua_pushfstring(in_RDI,"function: builtin#%d",(ulong)*(byte *)((ulong)(pTVar1->u32).lo + 6))
        ;
      }
      else {
        if ((pTVar1->field_2).it < 0xffff0000) {
          uVar6 = 0xd;
        }
        else if ((int)(pTVar1->field_2).it >> 0xf == -2) {
          in_stack_ffffffffffffff78 = 3;
          uVar6 = in_stack_ffffffffffffff78;
        }
        else {
          in_stack_ffffffffffffff78 = (pTVar1->field_2).it ^ 0xffffffff;
          uVar6 = in_stack_ffffffffffffff78;
        }
        pcVar5 = lj_obj_itypename[uVar6];
        pvVar4 = lua_topointer((lua_State *)CONCAT44(uVar6,in_stack_ffffffffffffff78),
                               (int)((ulong)pcVar5 >> 0x20));
        lua_pushfstring(in_RDI,"%s: %p",pcVar5,pvVar4);
      }
      local_78 = in_RDI->top[-1].field_2.field_0;
    }
    else {
      local_78 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
                  ((ulong)in_RDI->base[-1].u32.lo + 0x20 +
                  (long)(int)(-1 - (pTVar1->field_2).it) * 8);
    }
    pTVar1 = in_RDI->base;
    pTVar1[-1].u32.lo = (uint32_t)local_78;
    *(undefined4 *)((long)pTVar1 + -4) = 0xfffffffb;
    local_54 = 2;
  }
  else {
    in_RDI->base[-1] = *pcVar2;
    local_54 = -1;
  }
  return local_54;
}

Assistant:

LJLIB_ASM(tostring)		LJLIB_REC(.)
{
  TValue *o = lj_lib_checkany(L, 1);
  cTValue *mo;
  L->top = o+1;  /* Only keep one argument. */
  if (!tvisnil(mo = lj_meta_lookup(L, o, MM_tostring))) {
    copyTV(L, L->base-1, mo);  /* Replace callable. */
    return FFH_TAILCALL;
  } else {
    GCstr *s;
    if (tvisnumber(o)) {
      s = lj_str_fromnumber(L, o);
    } else if (tvispri(o)) {
      s = strV(lj_lib_upvalue(L, -(int32_t)itype(o)));
    } else {
      if (tvisfunc(o) && isffunc(funcV(o)))
	lua_pushfstring(L, "function: builtin#%d", funcV(o)->c.ffid);
      else
	lua_pushfstring(L, "%s: %p", lj_typename(o), lua_topointer(L, 1));
      /* Note: lua_pushfstring calls the GC which may invalidate o. */
      s = strV(L->top-1);
    }
    setstrV(L, L->base-1, s);
    return FFH_RES(1);
  }
}